

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O2

bool __thiscall Clasp::mt::ParallelHandler::attach(ParallelHandler *this,SharedContext *ctx)

{
  bool bVar1;
  SolveParams *pSVar2;
  RecBuffer ppSVar3;
  
  (this->gp_).restart = 0xffffffffffffffff;
  (this->gp_).modCount = 0;
  (this->gp_).type = gp_none;
  *(uint *)&this->field_0x58 = *(uint *)&this->field_0x58 & 0x80000000;
  pSVar2 = Solver::searchConfig(this->solver_);
  *(uint *)&this->field_0x58 =
       *(uint *)&this->field_0x58 & 0x7fffffff |
       (uint)(((uint)(pSVar2->reduce).strategy & 0x780) != 0) << 0x1f;
  (this->super_MessageHandler).super_PostPropagator.next = (PostPropagator *)0x0;
  if ((this->received_ == (RecBuffer)0x0) && (1 < (ctx->distributor).ptr_)) {
    ppSVar3 = (RecBuffer)operator_new__(0x100);
    this->received_ = ppSVar3;
  }
  SharedContext::report(ctx,"attach",this->solver_);
  Solver::addPost(this->solver_,(PostPropagator *)this);
  bVar1 = SharedContext::attach(ctx,SUB84(this->solver_->strategy_,4) >> 0x1a);
  return bVar1;
}

Assistant:

bool ParallelHandler::attach(SharedContext& ctx) {
	assert(solver_);
	gp_.reset();
	error_ = 0;
	win_   = 0;
	up_    = 0;
	act_   = 0;
	lbd_   = solver_->searchConfig().reduce.strategy.glue != 0;
	next   = 0;
	if (!received_ && ctx.distributor.get()) {
		received_ = new SharedLiterals*[RECEIVE_BUFFER_SIZE];
	}
	ctx.report("attach", solver_);
	solver_->addPost(this);
	return ctx.attach(solver_->id());
}